

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O0

bool tinyusdz::tydra::GetBoundMaterial
               (Stage *_stage,Path *abs_path,string *materialPurpose,Path *materialPath,
               Material **material,string *err)

{
  Prim *pPVar1;
  bool bVar2;
  ulong uVar3;
  reference this;
  string *psVar4;
  long lVar5;
  undefined1 local_468 [8];
  Path parentPath;
  Material *pMStack_390;
  bool has_directBound;
  Material *directMaterial;
  Path directMaterialPath;
  string _err;
  Prim *pPStack_290;
  bool ret;
  Prim *prim;
  Material *pMStack_280;
  uint32_t depth;
  Material *boundMaterial;
  Path boundMaterialPath;
  Path currentPath;
  Token *purpose;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range2;
  Token local_98;
  Token local_78;
  undefined1 local_58 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> purposes;
  string *err_local;
  Material **material_local;
  Path *materialPath_local;
  string *materialPurpose_local;
  Path *abs_path_local;
  Stage *_stage_local;
  
  if (materialPath == (Path *)0x0) {
    _stage_local._7_1_ = 0;
  }
  else if (material == (Material **)0x0) {
    _stage_local._7_1_ = 0;
  }
  else {
    purposes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)err;
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_58);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      Token::Token(&local_98,materialPurpose);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_58,&local_98);
      Token::~Token(&local_98);
      Token::Token((Token *)&__range2,"");
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_58,
                 (value_type *)&__range2);
      Token::~Token((Token *)&__range2);
    }
    else {
      Token::Token(&local_78,"");
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_58,&local_78);
      Token::~Token(&local_78);
    }
    __end2._M_current =
         (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_58);
    purpose = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::end
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  local_58);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                       *)&purpose), bVar2) {
      this = __gnu_cxx::
             __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
             ::operator*(&__end2);
      Path::Path((Path *)&boundMaterialPath._valid,abs_path);
      Path::Path((Path *)&boundMaterial);
      pMStack_280 = (Material *)0x0;
      prim._4_4_ = 0;
      do {
        if (((0x1ffff < prim._4_4_) ||
            (bVar2 = Path::is_valid((Path *)&boundMaterialPath._valid), !bVar2)) ||
           (bVar2 = Path::is_root_path((Path *)&boundMaterialPath._valid), bVar2)) break;
        pPStack_290 = (Prim *)0x0;
        bVar2 = Stage::find_prim_at_path
                          (_stage,(Path *)&boundMaterialPath._valid,&stack0xfffffffffffffd70,
                           &(purposes.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage)->str_);
        pPVar1 = pPStack_290;
        if (!bVar2) {
          _stage_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_0098508e;
        }
        if (pMStack_280 == (Material *)0x0) {
LAB_00984eb0:
          ::std::__cxx11::string::string((string *)&directMaterialPath._valid);
          Path::Path((Path *)&directMaterial);
          pPVar1 = pPStack_290;
          pMStack_390 = (Material *)0x0;
          psVar4 = Token::str_abi_cxx11_(this);
          parentPath._207_1_ =
               GetDirectlyBoundMaterial
                         (_stage,pPVar1,psVar4,(Path *)&directMaterial,&stack0xfffffffffffffc70,
                          (string *)&directMaterialPath._valid);
          if (((bool)parentPath._207_1_) && (pMStack_390 != (Material *)0x0)) {
            pMStack_280 = pMStack_390;
            Path::operator=((Path *)&boundMaterial,(Path *)&directMaterial);
LAB_00984f9c:
            bVar2 = false;
          }
          else {
            lVar5 = ::std::__cxx11::string::size();
            if (lVar5 == 0) goto LAB_00984f9c;
            if (purposes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::__cxx11::string::operator+=
                        ((string *)
                         purposes.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (string *)&directMaterialPath._valid);
            }
            _stage_local._7_1_ = 0;
            bVar2 = true;
          }
          Path::~Path((Path *)&directMaterial);
          ::std::__cxx11::string::~string((string *)&directMaterialPath._valid);
          if (bVar2) goto LAB_0098508e;
        }
        else {
          psVar4 = Token::str_abi_cxx11_(this);
          bVar2 = DirectBindingStrongerThanDescendants(_stage,pPVar1,psVar4);
          if (bVar2) goto LAB_00984eb0;
        }
        Path::get_parent_prim_path((Path *)local_468,(Path *)&boundMaterialPath._valid);
        Path::operator=((Path *)&boundMaterialPath._valid,(Path *)local_468);
        bVar2 = Path::is_root_prim((Path *)&boundMaterialPath._valid);
        if (bVar2) {
          _err.field_2._8_4_ = 5;
        }
        else {
          prim._4_4_ = prim._4_4_ + 1;
          _err.field_2._8_4_ = 0;
        }
        Path::~Path((Path *)local_468);
      } while (_err.field_2._8_4_ == 0);
      if (pMStack_280 == (Material *)0x0) {
        bVar2 = false;
      }
      else {
        *material = pMStack_280;
        Path::operator=(materialPath,(Path *)&boundMaterial);
        _stage_local._7_1_ = 1;
        bVar2 = true;
      }
LAB_0098508e:
      Path::~Path((Path *)&boundMaterial);
      Path::~Path((Path *)&boundMaterialPath._valid);
      if (bVar2) goto LAB_009850d3;
      __gnu_cxx::
      __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
      ::operator++(&__end2);
    }
    _stage_local._7_1_ = 0;
LAB_009850d3:
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_58);
  }
  return (bool)(_stage_local._7_1_ & 1);
}

Assistant:

bool GetBoundMaterial(
  const Stage &_stage,
  const Path &abs_path,
  const std::string &materialPurpose,
  tinyusdz::Path *materialPath,
  const Material **material,
  std::string *err) {

  if (materialPath == nullptr) {
    return false;
  }

  if (material == nullptr) {
    return false;
  }

  std::vector<value::token> purposes;
  if (materialPurpose.empty()) {
    purposes.push_back(value::token("")); // all-purpose
  } else {
    purposes.push_back(value::token(materialPurpose));
    purposes.push_back(value::token("")); // all-purpose
  }

  // for purpose : purposes:
  //
  //   boundMaterial = None
  //
  //   for p = prim, p != Root, p = p.GetParent():
  //
  //     if DirectBindingStrongerThanDescendants(p, purpose) or not boundMaterial:
  //
  //       if dicrectBind = GetDirectlyBoundMaterial(p, purpose):
  //
  //         boundMaterial = directBound
  //
  //     for collBinding : GetCollectionMaterialBindings(p, purpose):
  //
  //       if (collBinding.GetCollection().Contains(prim) and
  //           collBinding.IsStrongerThanDescendants() or not boundMaterial):
  //
  //         boundMaterial = collBinding.GetMaterial()
  //         break
  //
  //
  //   if boundMaterial:
  //     return boundMaterial
  //
  //
  // return False(or return default material)

  for (const auto &purpose : purposes) {

    Path currentPath = abs_path;
    Path boundMaterialPath;
    const Material *boundMaterial{nullptr};

    // We need to climb up to the root in any case.
    // TODO: Cache result.
    uint32_t depth = 0;
    while (depth < 1024*128) { // to avoid infinite loop.

      if (!currentPath.is_valid() || currentPath.is_root_path()) {
        break;
      }

      const Prim *prim{nullptr};
      bool ret = _stage.find_prim_at_path(currentPath, prim, err);
      if (!ret) {
        return false;
      }

      if (!boundMaterial || DirectBindingStrongerThanDescendants(_stage, *prim, purpose.str())) {

        std::string _err;
        Path directMaterialPath;
        const Material *directMaterial{nullptr};
        bool has_directBound = GetDirectlyBoundMaterial(_stage, *prim, purpose.str(), &directMaterialPath, &directMaterial, &_err);

        if (has_directBound && directMaterial) {

          boundMaterial = directMaterial;
          boundMaterialPath = directMaterialPath;
        
        } else if (_err.size()) {
          if (err) {
            (*err) += _err;
          }
          return false;
        }
      }

      Path parentPath = currentPath.get_parent_prim_path();
      DCOUT("search parent: " << parentPath.full_path_name());

      currentPath = parentPath;

      if (currentPath.is_root_prim()) {
        // parent is root('/'), so no need to follow the parent path anymore.
        break;
      }

      depth++;

      // TODO: collection
    }

    if (boundMaterial) {
      (*material) = boundMaterial;
      (*materialPath) = boundMaterialPath;
      return true;
    }
  }

  return false;
}